

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

void encode_field(upb_encstate *e,upb_Message *msg,upb_MiniTableSubInternal *subs,
                 upb_MiniTableField *field)

{
  uint *__src;
  int *piVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  upb_MiniTable *puVar5;
  upb_Map *map;
  ulong *puVar6;
  undefined8 *puVar7;
  uint *puVar8;
  long lVar9;
  char *pcVar10;
  _Bool _Var11;
  size_t sVar12;
  uint32_t tag;
  upb_MiniTable *puVar13;
  uint uVar14;
  upb_Array *arr;
  ulong uVar15;
  char *val_00;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  upb_StringView key;
  upb_value val;
  upb_MapEntry ent;
  intptr_t iter;
  upb_StringView local_90;
  undefined8 *local_80;
  upb_value local_78;
  anon_union_8_2_9eb4e620_for_upb_Message_0 local_70 [2];
  anon_union_16_3_fdccde34_for_k local_60;
  anon_union_16_3_fdccde34_for_v local_50;
  long local_40;
  intptr_t local_38;
  
  bVar2 = field->mode_dont_copy_me__upb_internal_use_only;
  switch(bVar2 & 3) {
  case 0:
    puVar5 = *subs[field->submsg_index_dont_copy_me__upb_internal_use_only].
              submsg_dont_copy_me__upb_internal_use_only;
    if (puVar5->field_count_dont_copy_me__upb_internal_use_only != 2) {
      __assert_fail("upb_MiniTable_FieldCount(layout) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/wire/encode.c"
                    ,0x1ba,
                    "void encode_map(upb_encstate *, const upb_Message *, const upb_MiniTableSubInternal *, const upb_MiniTableField *)"
                   );
    }
    map = *(upb_Map **)
           ((long)&msg->field_0 + (ulong)field->offset_dont_copy_me__upb_internal_use_only);
    if (map == (upb_Map *)0x0) {
      return;
    }
    sVar12 = upb_Map_Size(map);
    if (sVar12 == 0) {
      return;
    }
    if ((e->options & 1) == 0) {
      local_38 = -1;
      _Var11 = upb_strtable_next2(&map->table,&local_90,&local_78,&local_38);
      if (!_Var11) {
        return;
      }
      do {
        if ((long)map->key_size != 0) {
          memcpy(&local_60,(void *)CONCAT44(local_90.data._4_4_,(int)local_90.data),
                 (long)map->key_size);
        }
        local_80 = (undefined8 *)local_78.val;
        if ((long)map->val_size == 0) {
          local_50.str.data = (char *)*(undefined8 *)local_78.val;
          local_50.str.size = *(size_t *)(local_78.val + 8);
        }
        else {
          memcpy(&local_50,&local_80,(long)map->val_size);
        }
        encode_mapentry(e,field->number_dont_copy_me__upb_internal_use_only,puVar5,
                        (upb_MapEntry *)local_70);
        _Var11 = upb_strtable_next2(&map->table,&local_90,&local_78,&local_38);
      } while (_Var11);
      return;
    }
    _upb_mapsorter_pushmap
              (&e->sorter,
               (uint)puVar5->fields_dont_copy_me__upb_internal_use_only->
                     descriptortype_dont_copy_me__upb_internal_use_only,map,
               (_upb_sortedmap *)&local_90);
    if (local_90.data._4_4_ != (int)local_90.size) {
      do {
        puVar7 = (undefined8 *)(e->sorter).entries[local_90.data._4_4_];
        puVar8 = (uint *)*puVar7;
        __src = puVar8 + 1;
        if ((long)map->key_size == 0) {
          local_60.str.size = (size_t)*puVar8;
          local_90.data._4_4_ = local_90.data._4_4_ + 1;
          local_60.str.data = (char *)__src;
        }
        else {
          local_90.data._4_4_ = local_90.data._4_4_ + 1;
          memcpy(&local_60,__src,(long)map->key_size);
        }
        local_80 = (undefined8 *)puVar7[1];
        if ((long)map->val_size == 0) {
          local_50.str.data = (char *)*local_80;
          local_50.str.size = local_80[1];
        }
        else {
          memcpy(&local_50,&local_80,(long)map->val_size);
        }
        encode_mapentry(e,field->number_dont_copy_me__upb_internal_use_only,puVar5,
                        (upb_MapEntry *)local_70);
      } while (local_90.data._4_4_ != (int)local_90.size);
    }
    (e->sorter).size = (int)local_90.data;
    return;
  case 1:
    puVar6 = *(ulong **)
              ((long)&msg->field_0 + (ulong)field->offset_dont_copy_me__upb_internal_use_only);
    if (puVar6 == (ulong *)0x0) {
      return;
    }
    sVar12 = puVar6[1];
    if (sVar12 == 0) {
      return;
    }
    break;
  case 2:
    encode_scalar(e,(void *)((long)&msg->field_0 +
                            (ulong)field->offset_dont_copy_me__upb_internal_use_only),subs,field);
    return;
  case 3:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/wire/encode.c"
                  ,0x20a,
                  "void encode_field(upb_encstate *, const upb_Message *, const upb_MiniTableSubInternal *, const upb_MiniTableField *)"
                 );
  }
  local_40 = (long)e->ptr - (long)e->limit;
  switch(field->descriptortype_dont_copy_me__upb_internal_use_only) {
  case '\x01':
  case '\x06':
  case '\x10':
    arr = (upb_Array *)*puVar6;
    tag = 8;
    goto LAB_00120b34;
  case '\x02':
  case '\a':
  case '\x0f':
    arr = (upb_Array *)*puVar6;
    tag = 4;
LAB_00120b34:
    encode_fixedarray(e,arr,sVar12,tag);
    break;
  case '\x03':
  case '\x04':
    uVar17 = *puVar6;
    uVar16 = 0;
    if ((bVar2 & 4) == 0) {
      uVar16 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar18 = sVar12 << 3;
    do {
      uVar15 = *(ulong *)(((uVar17 & 0xfffffffffffffff8) - 8) + lVar18);
      if ((uVar15 < 0x80) && (pcVar10 = e->ptr, pcVar10 != e->buf)) {
        e->ptr = pcVar10 + -1;
        pcVar10[-1] = (char)uVar15;
      }
      else {
        encode_longvarint(e,uVar15);
      }
      if ((ulong)uVar16 != 0) {
        if ((uVar16 < 0x80) && (pcVar10 = e->ptr, pcVar10 != e->buf)) {
          e->ptr = pcVar10 + -1;
          pcVar10[-1] = (char)uVar16;
        }
        else {
          encode_longvarint(e,(ulong)uVar16);
        }
      }
      lVar18 = lVar18 + -8;
    } while (lVar18 != 0);
    break;
  case '\x05':
  case '\x0e':
    uVar17 = *puVar6;
    uVar16 = 0;
    if ((bVar2 & 4) == 0) {
      uVar16 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar18 = sVar12 << 2;
    do {
      iVar4 = *(int *)(((uVar17 & 0xfffffffffffffff8) - 4) + lVar18);
      if (((ulong)(long)iVar4 < 0x80) && (pcVar10 = e->ptr, pcVar10 != e->buf)) {
        e->ptr = pcVar10 + -1;
        pcVar10[-1] = (char)iVar4;
      }
      else {
        encode_longvarint(e,(long)iVar4);
      }
      if ((ulong)uVar16 != 0) {
        if ((uVar16 < 0x80) && (pcVar10 = e->ptr, pcVar10 != e->buf)) {
          e->ptr = pcVar10 + -1;
          pcVar10[-1] = (char)uVar16;
        }
        else {
          encode_longvarint(e,(ulong)uVar16);
        }
      }
      lVar18 = lVar18 + -4;
    } while (lVar18 != 0);
    break;
  case '\b':
    uVar17 = *puVar6;
    uVar16 = 0;
    if ((bVar2 & 4) == 0) {
      uVar16 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    do {
      bVar3 = *(byte *)(((uVar17 & 0xfffffffffffffff8) - 1) + sVar12);
      pcVar10 = e->ptr;
      if (pcVar10 == e->buf) {
        encode_longvarint(e,(ulong)bVar3);
      }
      else {
        e->ptr = pcVar10 + -1;
        pcVar10[-1] = bVar3;
      }
      if ((ulong)uVar16 != 0) {
        if ((uVar16 < 0x80) && (pcVar10 = e->ptr, pcVar10 != e->buf)) {
          e->ptr = pcVar10 + -1;
          pcVar10[-1] = (char)uVar16;
        }
        else {
          encode_longvarint(e,(ulong)uVar16);
        }
      }
      sVar12 = sVar12 - 1;
    } while (sVar12 != 0);
    break;
  case '\t':
  case '\f':
    uVar17 = *puVar6 & 0xfffffffffffffff8;
    lVar18 = sVar12 << 4;
    do {
      encode_bytes(e,*(void **)((uVar17 - 0x10) + lVar18),*(size_t *)((uVar17 - 8) + lVar18));
      uVar15 = *(ulong *)((uVar17 - 8) + lVar18);
      if ((uVar15 < 0x80) && (pcVar10 = e->ptr, pcVar10 != e->buf)) {
        e->ptr = pcVar10 + -1;
        pcVar10[-1] = (char)uVar15;
      }
      else {
        encode_longvarint(e,uVar15);
      }
      uVar16 = field->number_dont_copy_me__upb_internal_use_only * 8 + 2;
      if ((field->number_dont_copy_me__upb_internal_use_only << 3 < 0x80) &&
         (pcVar10 = e->ptr, pcVar10 != e->buf)) {
        e->ptr = pcVar10 + -1;
        pcVar10[-1] = (char)uVar16;
      }
      else {
        encode_longvarint(e,(ulong)uVar16);
      }
      lVar18 = lVar18 + -0x10;
    } while (lVar18 != 0);
    return;
  case '\n':
    uVar17 = *puVar6;
    puVar5 = *subs[field->submsg_index_dont_copy_me__upb_internal_use_only].
              submsg_dont_copy_me__upb_internal_use_only;
    piVar1 = &e->depth;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
LAB_0012120a:
      encode_err(e,kUpb_EncodeStatus_MaxDepthExceeded);
    }
    lVar18 = sVar12 << 3;
    do {
      uVar16 = field->number_dont_copy_me__upb_internal_use_only * 8 + 4;
      if ((field->number_dont_copy_me__upb_internal_use_only << 3 < 0x80) &&
         (pcVar10 = e->ptr, pcVar10 != e->buf)) {
        e->ptr = pcVar10 + -1;
        pcVar10[-1] = (char)uVar16;
      }
      else {
        encode_longvarint(e,(ulong)uVar16);
      }
      uVar15 = *(ulong *)(((uVar17 & 0xfffffffffffffff8) - 8) + lVar18);
      puVar13 = puVar5;
      if ((uVar15 & 1) != 0) {
        puVar13 = &_kUpb_MiniTable_Empty_dont_copy_me__upb_internal_use_only;
      }
      encode_message(e,(upb_Message *)(uVar15 & 0xfffffffffffffffe),puVar13,
                     &local_70[0].internal_opaque);
      uVar16 = field->number_dont_copy_me__upb_internal_use_only * 8 + 3;
      if ((field->number_dont_copy_me__upb_internal_use_only << 3 < 0x80) &&
         (pcVar10 = e->ptr, pcVar10 != e->buf)) {
        e->ptr = pcVar10 + -1;
        pcVar10[-1] = (char)uVar16;
      }
      else {
        encode_longvarint(e,(ulong)uVar16);
      }
      lVar18 = lVar18 + -8;
    } while (lVar18 != 0);
    goto LAB_00121099;
  case '\v':
    uVar17 = *puVar6;
    puVar5 = *subs[field->submsg_index_dont_copy_me__upb_internal_use_only].
              submsg_dont_copy_me__upb_internal_use_only;
    piVar1 = &e->depth;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) goto LAB_0012120a;
    lVar18 = sVar12 << 3;
    do {
      uVar15 = *(ulong *)(((uVar17 & 0xfffffffffffffff8) - 8) + lVar18);
      puVar13 = puVar5;
      if ((uVar15 & 1) != 0) {
        puVar13 = &_kUpb_MiniTable_Empty_dont_copy_me__upb_internal_use_only;
      }
      encode_message(e,(upb_Message *)(uVar15 & 0xfffffffffffffffe),puVar13,
                     &local_70[0].internal_opaque);
      if (((ulong)local_70[0] < 0x80) && (pcVar10 = e->ptr, pcVar10 != e->buf)) {
        e->ptr = pcVar10 + -1;
        pcVar10[-1] = (char)local_70[0].internal_opaque;
      }
      else {
        encode_longvarint(e,local_70[0].internal_opaque);
      }
      uVar16 = field->number_dont_copy_me__upb_internal_use_only * 8 + 2;
      if ((field->number_dont_copy_me__upb_internal_use_only << 3 < 0x80) &&
         (pcVar10 = e->ptr, pcVar10 != e->buf)) {
        e->ptr = pcVar10 + -1;
        pcVar10[-1] = (char)uVar16;
      }
      else {
        encode_longvarint(e,(ulong)uVar16);
      }
      lVar18 = lVar18 + -8;
    } while (lVar18 != 0);
LAB_00121099:
    e->depth = e->depth + 1;
    return;
  case '\r':
    uVar17 = *puVar6;
    uVar16 = 0;
    if ((bVar2 & 4) == 0) {
      uVar16 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar18 = sVar12 << 2;
    do {
      uVar14 = *(uint *)(((uVar17 & 0xfffffffffffffff8) - 4) + lVar18);
      if (((ulong)uVar14 < 0x80) && (pcVar10 = e->ptr, pcVar10 != e->buf)) {
        e->ptr = pcVar10 + -1;
        pcVar10[-1] = (char)uVar14;
      }
      else {
        encode_longvarint(e,(ulong)uVar14);
      }
      if ((ulong)uVar16 != 0) {
        if ((uVar16 < 0x80) && (pcVar10 = e->ptr, pcVar10 != e->buf)) {
          e->ptr = pcVar10 + -1;
          pcVar10[-1] = (char)uVar16;
        }
        else {
          encode_longvarint(e,(ulong)uVar16);
        }
      }
      lVar18 = lVar18 + -4;
    } while (lVar18 != 0);
    break;
  case '\x11':
    uVar17 = *puVar6;
    uVar16 = 0;
    if ((bVar2 & 4) == 0) {
      uVar16 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar18 = sVar12 << 2;
    do {
      iVar4 = *(int *)(((uVar17 & 0xfffffffffffffff8) - 4) + lVar18);
      uVar14 = iVar4 >> 0x1f ^ iVar4 * 2;
      if ((uVar14 < 0x80) && (pcVar10 = e->ptr, pcVar10 != e->buf)) {
        e->ptr = pcVar10 + -1;
        pcVar10[-1] = (char)uVar14;
      }
      else {
        encode_longvarint(e,(ulong)uVar14);
      }
      if ((ulong)uVar16 != 0) {
        if ((uVar16 < 0x80) && (pcVar10 = e->ptr, pcVar10 != e->buf)) {
          e->ptr = pcVar10 + -1;
          pcVar10[-1] = (char)uVar16;
        }
        else {
          encode_longvarint(e,(ulong)uVar16);
        }
      }
      lVar18 = lVar18 + -4;
    } while (lVar18 != 0);
    break;
  case '\x12':
    uVar17 = *puVar6;
    uVar16 = 0;
    if ((bVar2 & 4) == 0) {
      uVar16 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar18 = sVar12 << 3;
    do {
      lVar9 = *(long *)(((uVar17 & 0xfffffffffffffff8) - 8) + lVar18);
      uVar15 = lVar9 >> 0x3f ^ lVar9 * 2;
      if ((uVar15 < 0x80) && (pcVar10 = e->ptr, pcVar10 != e->buf)) {
        e->ptr = pcVar10 + -1;
        pcVar10[-1] = (char)uVar15;
      }
      else {
        encode_longvarint(e,uVar15);
      }
      if ((ulong)uVar16 != 0) {
        if ((uVar16 < 0x80) && (pcVar10 = e->ptr, pcVar10 != e->buf)) {
          e->ptr = pcVar10 + -1;
          pcVar10[-1] = (char)uVar16;
        }
        else {
          encode_longvarint(e,(ulong)uVar16);
        }
      }
      lVar18 = lVar18 + -8;
    } while (lVar18 != 0);
  }
  if ((bVar2 & 4) != 0) {
    pcVar10 = e->ptr;
    val_00 = e->limit + (local_40 - (long)pcVar10);
    if ((val_00 < (char *)0x80) && (pcVar10 != e->buf)) {
      e->ptr = pcVar10 + -1;
      pcVar10[-1] = (char)val_00;
    }
    else {
      encode_longvarint(e,(uint64_t)val_00);
    }
    uVar16 = field->number_dont_copy_me__upb_internal_use_only * 8 + 2;
    if ((0x7f < field->number_dont_copy_me__upb_internal_use_only << 3) ||
       (pcVar10 = e->ptr, pcVar10 == e->buf)) {
      encode_longvarint(e,(ulong)uVar16);
      return;
    }
    e->ptr = pcVar10 + -1;
    pcVar10[-1] = (char)uVar16;
  }
  return;
}

Assistant:

static void encode_field(upb_encstate* e, const upb_Message* msg,
                         const upb_MiniTableSubInternal* subs,
                         const upb_MiniTableField* field) {
  switch (UPB_PRIVATE(_upb_MiniTableField_Mode)(field)) {
    case kUpb_FieldMode_Array:
      encode_array(e, msg, subs, field);
      break;
    case kUpb_FieldMode_Map:
      encode_map(e, msg, subs, field);
      break;
    case kUpb_FieldMode_Scalar:
      encode_scalar(e, UPB_PTR_AT(msg, field->UPB_PRIVATE(offset), void), subs,
                    field);
      break;
    default:
      UPB_UNREACHABLE();
  }
}